

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall
QZipStreamStrategy::addFile(QZipStreamStrategy *this,QString *fileName,QString *mimeType)

{
  QXmlStreamWriter *pQVar1;
  char16_t *pcVar2;
  ulong uVar3;
  size_t in_R9;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QAnyStringView QVar5;
  QByteArrayView QVar6;
  QAnyStringView QVar7;
  QByteArrayView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QArrayData *local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->manifestWriter;
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar4.m_data = (storage_type *)0xa;
  QVar4.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar4);
  QVar5.m_size = (size_t)pcVar2;
  QVar5.field_0.m_data = pQVar1;
  QVar10.m_size = local_48;
  QVar10.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar5,QVar10);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar6.m_data = (storage_type *)0xa;
  QVar6.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar6);
  QVar13.field_0.m_data = (void *)(local_40 | 0x8000000000000000);
  QVar7.m_size = (size_t)pcVar2;
  QVar7.field_0.m_data = pQVar1;
  QVar11.m_size = local_48;
  QVar11.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QVar13.m_size = in_R9;
  QXmlStreamWriter::writeAttribute(QVar7,QVar11,QVar13);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar8.m_data = (storage_type *)0x9;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar8);
  QVar14.field_0.m_data = (void *)(local_40 | 0x8000000000000000);
  QVar9.m_size = (size_t)pcVar2;
  QVar9.field_0.m_data = pQVar1;
  QVar12.m_size = local_48;
  QVar12.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QVar14.m_size = in_R9;
  QXmlStreamWriter::writeAttribute(QVar9,QVar12,QVar14);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addFile(const QString &fileName, const QString &mimeType)
    {
        manifestWriter.writeEmptyElement(manifestNS, QString::fromLatin1("file-entry"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("media-type"), mimeType);
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("full-path"), fileName);
    }